

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_lineOrder
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  int iVar1;
  exr_result_t eVar2;
  uint8_t *in_RCX;
  _internal_exr_seq_scratch *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  int32_t in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_attribute_list_t *in_stack_00000010;
  exr_result_t rv;
  undefined4 in_stack_00000018;
  uint8_t data;
  int32_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  code cVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = strcmp((char *)in_RCX,"lineOrder");
  if (iVar1 == 0) {
    eVar2 = extract_attr_uint8(in_RSI,in_RDX,in_RCX,
                               (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                               ,in_stack_ffffffffffffffc4,(uint8_t)unaff_retaddr);
    cVar3 = SUB41((uint)in_stack_ffffffffffffffd0 >> 0x18,0);
    if (eVar2 == 0) {
      if (in_RSI->report_error ==
          (_func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *)0x0) {
        eVar2 = exr_attr_list_add_static_name
                          ((exr_context_t)CONCAT44(attrsz,in_stack_00000018),in_stack_00000010,
                           in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                           (uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                           ,(exr_attribute_t **)curpart);
        if (eVar2 == 0) {
          in_RSI->report_error[0x18] = cVar3;
          *(uint *)((long)&in_RSI->output_file_offset + 4) = (uint)(byte)cVar3;
          eVar2 = 0;
        }
        else {
          eVar2 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,eVar2,
                             "Unable to initialize attribute \'%s\', type \'lineOrder\'","lineOrder"
                            );
        }
      }
      else if (*(char *)(in_RDI + 6) == '\0') {
        in_RSI->report_error[0x18] = cVar3;
        *(uint *)((long)&in_RSI->output_file_offset + 4) = (uint)(byte)cVar3;
        eVar2 = 0;
      }
      else {
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,0xe,"Duplicate copy of required attribute \'%s\' encountered",
                           "lineOrder");
      }
    }
  }
  else {
    (*in_RDX->sequential_skip)(in_RDX,in_R8D);
    eVar2 = (**(code **)(in_RDI + 0x48))
                      (in_RDI,0x10,"Required attribute \'%s\': Invalid type \'%s\'","lineOrder",
                       in_RCX);
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_lineOrder (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    uint8_t      data;
    exr_result_t rv;

    if (0 != strcmp (tname, EXR_REQ_LO_STR))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute '%s': Invalid type '%s'",
            EXR_REQ_LO_STR,
            tname);
    }

    rv = extract_attr_uint8 (
        ctxt,
        scratch,
        &data,
        EXR_REQ_LO_STR,
        tname,
        attrsz,
        (uint8_t) EXR_LINEORDER_LAST_TYPE);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (curpart->lineOrder)
    {
        if (ctxt->strict_header)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Duplicate copy of required attribute '%s' encountered",
                EXR_REQ_LO_STR);
        }

        /* legacy code allowed attributes to just overwrite, preserve
         * that behavior (barring other failure)
         */
        curpart->lineOrder->uc = data;
        curpart->lineorder     = data;
        return EXR_ERR_SUCCESS;
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_LO_STR,
        EXR_ATTR_LINEORDER,
        0,
        NULL,
        &(curpart->lineOrder));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'lineOrder'",
            EXR_REQ_LO_STR);

    curpart->lineOrder->uc = data;
    curpart->lineorder     = data;
    return rv;
}